

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.h
# Opt level: O0

Ref<embree::SceneGraph::LightNode> __thiscall
embree::SceneGraph::AnimatedLightNode::get(AnimatedLightNode *this,float time)

{
  size_type sVar1;
  long in_RSI;
  LightNode *in_RDI;
  float in_XMM0_Da;
  float fVar2;
  Ref<embree::SceneGraph::LightNode> light1;
  Ref<embree::SceneGraph::LightNode> light0;
  float ftime;
  int itime;
  int local_cc;
  int local_c4;
  float local_a0;
  long *local_90;
  long *local_88;
  float local_7c;
  int local_78;
  float local_74;
  long **local_60;
  long **local_50;
  long **local_40;
  const_reference local_38;
  const_reference local_30;
  float local_24;
  float *local_20;
  float local_18;
  float local_14;
  int local_10;
  int local_c;
  undefined4 local_8;
  int local_4;
  
  local_20 = (float *)(in_RSI + 0x80);
  fVar2 = (in_XMM0_Da - *(float *)(in_RSI + 0x80)) / (*(float *)(in_RSI + 0x84) - *local_20);
  local_24 = fVar2;
  local_18 = fVar2;
  local_74 = floorf(fVar2);
  local_74 = fVar2 - local_74;
  sVar1 = std::
          vector<embree::Ref<embree::SceneGraph::LightNode>,_std::allocator<embree::Ref<embree::SceneGraph::LightNode>_>_>
          ::size((vector<embree::Ref<embree::SceneGraph::LightNode>,_std::allocator<embree::Ref<embree::SceneGraph::LightNode>_>_>
                  *)(in_RSI + 0x68));
  local_a0 = (float)(sVar1 - 1);
  local_74 = local_a0 * local_74;
  local_14 = local_74;
  fVar2 = floorf(local_74);
  local_78 = (int)fVar2;
  local_8 = 0;
  local_c4 = local_78;
  if (local_78 < 0) {
    local_c4 = 0;
  }
  local_4 = local_78;
  sVar1 = std::
          vector<embree::Ref<embree::SceneGraph::LightNode>,_std::allocator<embree::Ref<embree::SceneGraph::LightNode>_>_>
          ::size((vector<embree::Ref<embree::SceneGraph::LightNode>,_std::allocator<embree::Ref<embree::SceneGraph::LightNode>_>_>
                  *)(in_RSI + 0x68));
  local_10 = (int)sVar1 + -2;
  local_c = local_c4;
  local_cc = local_10;
  if (local_c4 < local_10) {
    local_cc = local_c4;
  }
  local_78 = local_cc;
  local_7c = local_74 - (float)local_cc;
  local_30 = std::
             vector<embree::Ref<embree::SceneGraph::LightNode>,_std::allocator<embree::Ref<embree::SceneGraph::LightNode>_>_>
             ::operator[]((vector<embree::Ref<embree::SceneGraph::LightNode>,_std::allocator<embree::Ref<embree::SceneGraph::LightNode>_>_>
                           *)(in_RSI + 0x68),(long)local_cc);
  (*(local_30->ptr->super_Node).super_RefCount._vptr_RefCount[0x12])(local_74,&local_88);
  local_38 = std::
             vector<embree::Ref<embree::SceneGraph::LightNode>,_std::allocator<embree::Ref<embree::SceneGraph::LightNode>_>_>
             ::operator[]((vector<embree::Ref<embree::SceneGraph::LightNode>,_std::allocator<embree::Ref<embree::SceneGraph::LightNode>_>_>
                           *)(in_RSI + 0x68),(long)(local_78 + 1));
  (*(local_38->ptr->super_Node).super_RefCount._vptr_RefCount[0x12])(local_74,&local_90);
  local_40 = &local_88;
  (**(code **)(*local_88 + 0x88))(local_7c,in_RDI,local_88,&local_90);
  local_60 = &local_90;
  if (local_90 != (long *)0x0) {
    (**(code **)(*local_90 + 0x18))();
  }
  local_50 = &local_88;
  if (local_88 != (long *)0x0) {
    (**(code **)(*local_88 + 0x18))();
  }
  return (Ref<embree::SceneGraph::LightNode>)in_RDI;
}

Assistant:

virtual Ref<LightNode> get(float time) const
      {
        time = frac((time-time_range.lower)/time_range.size());
        time = (lights.size()-1)*time;
        int   itime = (int)floor(time);
        itime = min(max(itime,0),(int)lights.size()-2);
        float ftime = time - (float)itime;
        Ref<LightNode> light0 = lights[itime+0]->get(time);
        Ref<LightNode> light1 = lights[itime+1]->get(time);
        return light0->lerp(light1,ftime);
      }